

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O0

JavascriptString * __thiscall Js::ScriptFunction::EnsureSourceString(ScriptFunction *this)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  uint uVar4;
  Utf8SourceInfo *pUVar5;
  ThreadContext *this_00;
  undefined4 *puVar6;
  char16 *pcVar7;
  Recycler *pRVar8;
  char16_t *dest;
  JavascriptLibrary *this_01;
  TrackAllocData local_c8;
  char16_t *local_a0;
  char16 *buffer;
  Recycler *recycler;
  size_t decodedCount;
  DecodeOptions options;
  BufferStringBuilder builder;
  PrintOffsets *printOffsets;
  size_t cbPreludeLength;
  LPCUTF8 pbStart;
  size_t cbLength;
  char16 *pcStack_50;
  charcount_t cch;
  PCWSTR displayName;
  Utf8SourceInfo *pUStack_40;
  charcount_t displayNameLength;
  Utf8SourceInfo *source;
  ScriptContext *scriptContext;
  JavascriptString *cachedSourceString;
  ParseableFunctionInfo *pFuncBody;
  FunctionProxy *proxy;
  ScriptFunction *this_local;
  
  proxy = (FunctionProxy *)this;
  pFuncBody = (ParseableFunctionInfo *)GetFunctionProxy(this);
  cachedSourceString =
       (JavascriptString *)FunctionProxy::EnsureDeserialized((FunctionProxy *)pFuncBody);
  scriptContext =
       (ScriptContext *)
       ParseableFunctionInfo::GetCachedSourceString((ParseableFunctionInfo *)cachedSourceString);
  if (scriptContext != (ScriptContext *)0x0) {
    return (JavascriptString *)(ScriptFunction *)scriptContext;
  }
  source = (Utf8SourceInfo *)RecyclableObject::GetScriptContext((RecyclableObject *)this);
  pUStack_40 = FunctionProxy::GetUtf8SourceInfo((FunctionProxy *)cachedSourceString);
  if (((pUStack_40 != (Utf8SourceInfo *)0x0) &&
      (bVar2 = Utf8SourceInfo::GetIsLibraryCode(pUStack_40), bVar2)) ||
     (bVar2 = ParseableFunctionInfo::IsWasmFunction((ParseableFunctionInfo *)cachedSourceString),
     bVar2)) {
    displayName._4_4_ = 0;
    pcStack_50 = FunctionProxy::GetShortDisplayName
                           ((FunctionProxy *)cachedSourceString,
                            (charcount_t *)((long)&displayName + 4));
    scriptContext =
         (ScriptContext *)
         JavascriptFunction::GetLibraryCodeDisplayString((ScriptContext *)source,pcStack_50);
    goto LAB_01372aa6;
  }
  pUVar5 = FunctionProxy::GetUtf8SourceInfo((FunctionProxy *)cachedSourceString);
  bVar2 = Utf8SourceInfo::GetIsXDomain(pUVar5);
  if (bVar2) {
LAB_01372a8f:
    this_01 = ScriptContext::GetLibrary((ScriptContext *)source);
    scriptContext = (ScriptContext *)JavascriptLibrary::GetXDomainFunctionDisplayString(this_01);
  }
  else {
    pUVar5 = FunctionProxy::GetUtf8SourceInfo((FunctionProxy *)cachedSourceString);
    bVar2 = Utf8SourceInfo::GetIsXDomainString(pUVar5);
    if (bVar2) {
      this_00 = ScriptContext::GetThreadContext((ScriptContext *)source);
      BVar3 = ThreadContext::HasUnhandledException(this_00);
      if (BVar3 != 0) goto LAB_01372a8f;
    }
    cbLength._4_4_ =
         ParseableFunctionInfo::LengthInChars((ParseableFunctionInfo *)cachedSourceString);
    uVar4 = ParseableFunctionInfo::LengthInBytes((ParseableFunctionInfo *)cachedSourceString);
    pbStart = (LPCUTF8)(ulong)uVar4;
    cbPreludeLength =
         (size_t)ParseableFunctionInfo::GetToStringSource
                           ((ParseableFunctionInfo *)cachedSourceString,
                            L"ScriptFunction::EnsureSourceString");
    printOffsets = (PrintOffsets *)0x0;
    builder.m_string =
         (WritableString *)
         ParseableFunctionInfo::GetPrintOffsets((ParseableFunctionInfo *)cachedSourceString);
    if ((PrintOffsets *)builder.m_string != (PrintOffsets *)0x0) {
      if ((LPCUTF8)(ulong)(((PrintOffsets *)builder.m_string)->cbEndPrintOffset -
                          ((PrintOffsets *)builder.m_string)->cbStartPrintOffset) < pbStart) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                    ,0x182,
                                    "((printOffsets->cbEndPrintOffset - printOffsets->cbStartPrintOffset) >= cbLength)"
                                    ,
                                    "(printOffsets->cbEndPrintOffset - printOffsets->cbStartPrintOffset) >= cbLength"
                                   );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      printOffsets = (PrintOffsets *)
                     ((ulong)(uint)(*(int *)((long)&((builder.m_string)->super_JavascriptString).
                                                    super_RecyclableObject.super_FinalizableObject.
                                                    super_IRecyclerVisitedObject.
                                                    _vptr_IRecyclerVisitedObject + 4) -
                                   *(int *)&((builder.m_string)->super_JavascriptString).
                                            super_RecyclableObject.super_FinalizableObject.
                                            super_IRecyclerVisitedObject.
                                            _vptr_IRecyclerVisitedObject) - (long)pbStart);
      uVar4 = ParseableFunctionInfo::StartOffset((ParseableFunctionInfo *)cachedSourceString);
      if (uVar4 < *(uint *)&((builder.m_string)->super_JavascriptString).super_RecyclableObject.
                            super_FinalizableObject.super_IRecyclerVisitedObject.
                            _vptr_IRecyclerVisitedObject) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                    ,0x185,
                                    "(pFuncBody->StartOffset() >= printOffsets->cbStartPrintOffset)"
                                    ,"pFuncBody->StartOffset() >= printOffsets->cbStartPrintOffset")
        ;
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      pbStart = (LPCUTF8)(ulong)(uint)(*(int *)((long)&((builder.m_string)->super_JavascriptString).
                                                       super_RecyclableObject.
                                                       super_FinalizableObject.
                                                       super_IRecyclerVisitedObject.
                                                       _vptr_IRecyclerVisitedObject + 4) -
                                      *(int *)&((builder.m_string)->super_JavascriptString).
                                               super_RecyclableObject.super_FinalizableObject.
                                               super_IRecyclerVisitedObject.
                                               _vptr_IRecyclerVisitedObject);
    }
    if ((PrintOffsets *)0x7ffffffd < printOffsets) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                  ,0x188,"(cbPreludeLength < MaxCharCount)",
                                  "cbPreludeLength < MaxCharCount");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    BufferStringBuilder::BufferStringBuilder
              ((BufferStringBuilder *)&stack0xffffffffffffff80,cbLength._4_4_ + (int)printOffsets,
               (ScriptContext *)source);
    pUVar5 = FunctionProxy::GetUtf8SourceInfo((FunctionProxy *)cachedSourceString);
    bVar2 = Utf8SourceInfo::IsCesu8(pUVar5);
    decodedCount._4_4_ = (DecodeOptions)bVar2;
    pcVar7 = BufferStringBuilder::DangerousGetWritableBuffer
                       ((BufferStringBuilder *)&stack0xffffffffffffff80);
    recycler = (Recycler *)
               utf8::DecodeUnitsInto
                         (pcVar7,(LPCUTF8 *)&cbPreludeLength,pbStart + cbPreludeLength,
                          decodedCount._4_4_,(bool *)0x0);
    if (recycler < (Recycler *)(ulong)cbLength._4_4_) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                  ,0x194,"(false)",
                                  "Decoded incorrect number of characters for function body");
      if (bVar2) {
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
        Throw::FatalInternalError(-0x7fffbffb);
      }
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    if (recycler < (Recycler *)(ulong)(cbLength._4_4_ + (int)printOffsets)) {
      pRVar8 = ScriptContext::GetRecycler((ScriptContext *)source);
      buffer = (char16 *)pRVar8;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_c8,(type_info *)&char16_t::typeinfo,0,(size_t)((long)&recycler->Cookie + 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                 ,0x19b);
      pRVar8 = Memory::Recycler::TrackAllocInfo(pRVar8,&local_c8);
      dest = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                       ((Memory *)pRVar8,(Recycler *)Memory::Recycler::AllocLeaf,0,
                        (size_t)((long)&recycler->Cookie + 1));
      pRVar8 = recycler;
      local_a0 = dest;
      pcVar7 = BufferStringBuilder::DangerousGetWritableBuffer
                         ((BufferStringBuilder *)&stack0xffffffffffffff80);
      wmemcpy_s(dest,(size_t)pRVar8,pcVar7,(size_t)recycler);
      local_a0[(long)recycler] = L'\0';
      scriptContext =
           (ScriptContext *)
           JavascriptString::NewWithBuffer(local_a0,(charcount_t)recycler,(ScriptContext *)source);
    }
    else {
      scriptContext =
           (ScriptContext *)
           BufferStringBuilder::ToString((BufferStringBuilder *)&stack0xffffffffffffff80);
    }
  }
LAB_01372aa6:
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                ,0x1aa,"(cachedSourceString != nullptr)",
                                "cachedSourceString != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  ParseableFunctionInfo::SetCachedSourceString
            ((ParseableFunctionInfo *)cachedSourceString,(JavascriptString *)scriptContext);
  return (JavascriptString *)(ScriptFunction *)scriptContext;
}

Assistant:

JavascriptString * ScriptFunction::EnsureSourceString()
    {
        // The function may be defer serialize, need to be deserialized
        FunctionProxy* proxy = this->GetFunctionProxy();
        ParseableFunctionInfo * pFuncBody = proxy->EnsureDeserialized();
        JavascriptString * cachedSourceString = pFuncBody->GetCachedSourceString();
        if (cachedSourceString != nullptr)
        {
            return cachedSourceString;
        }

        ScriptContext * scriptContext = this->GetScriptContext();

        //Library code should behave the same way as RuntimeFunctions
        Utf8SourceInfo* source = pFuncBody->GetUtf8SourceInfo();
        if ((source != nullptr && source->GetIsLibraryCode())
#ifdef ENABLE_WASM
            || (pFuncBody->IsWasmFunction())
#endif
            )
        {
            //Don't display if it is anonymous function
            charcount_t displayNameLength = 0;
            PCWSTR displayName = pFuncBody->GetShortDisplayName(&displayNameLength);
            cachedSourceString = JavascriptFunction::GetLibraryCodeDisplayString(scriptContext, displayName);
        }
        else if (!pFuncBody->GetUtf8SourceInfo()->GetIsXDomain()
            // To avoid backward compat issue, we will not give out sourceString for function if it is called from
            // window.onerror trying to retrieve arguments.callee.caller.
            && !(pFuncBody->GetUtf8SourceInfo()->GetIsXDomainString() && scriptContext->GetThreadContext()->HasUnhandledException())
            )
        {
            // Decode UTF8 into Unicode
            // Consider: Should we have a JavascriptUtf8Substring class which defers decoding
            // until it's needed?

            charcount_t cch = pFuncBody->LengthInChars();
            size_t cbLength = pFuncBody->LengthInBytes();
            LPCUTF8 pbStart = pFuncBody->GetToStringSource(_u("ScriptFunction::EnsureSourceString"));
            size_t cbPreludeLength = 0;
            // cch and cbLength refer to the length of the parse, which may be smaller than the length of the to-string function
            PrintOffsets* printOffsets = pFuncBody->GetPrintOffsets();
            if (printOffsets != nullptr)
            {
                Assert((printOffsets->cbEndPrintOffset - printOffsets->cbStartPrintOffset) >= cbLength);
                cbPreludeLength = (printOffsets->cbEndPrintOffset - printOffsets->cbStartPrintOffset) - cbLength;

                Assert(pFuncBody->StartOffset() >= printOffsets->cbStartPrintOffset);
                cbLength = printOffsets->cbEndPrintOffset - printOffsets->cbStartPrintOffset;
            }
            Assert(cbPreludeLength < MaxCharCount);
            // the toString of a function may include some prelude, e.g. the computed name expression.
            // We do not store the char-index of the start, but if there are cbPreludeLength bytes difference,
            // then that is an upper bound on the number of characters difference.
            // We also assume that function.toString is relatively infrequent, and non-ascii characters in
            // a prelude are relatively infrequent, so the inaccuracy here should in general be insignificant
            BufferStringBuilder builder(cch + static_cast<charcount_t>(cbPreludeLength), scriptContext);
            utf8::DecodeOptions options = pFuncBody->GetUtf8SourceInfo()->IsCesu8() ? utf8::doAllowThreeByteSurrogates : utf8::doDefault;
            size_t decodedCount = utf8::DecodeUnitsInto(builder.DangerousGetWritableBuffer(), pbStart, pbStart + cbLength, options);

            if (decodedCount < cch)
            {
                AssertMsg(false, "Decoded incorrect number of characters for function body");
                Js::Throw::FatalInternalError();
            }
            else if (decodedCount < cch + static_cast<charcount_t>(cbPreludeLength))
            {
                Recycler* recycler = scriptContext->GetRecycler();

                char16* buffer = RecyclerNewArrayLeaf(recycler, char16, decodedCount + 1);
                wmemcpy_s(buffer, decodedCount, builder.DangerousGetWritableBuffer(), decodedCount);
                buffer[decodedCount] = 0;

                cachedSourceString = JavascriptString::NewWithBuffer(buffer, static_cast<charcount_t>(decodedCount), scriptContext);
            }
            else
            {
                cachedSourceString = builder.ToString();
            }
        }
        else
        {
            cachedSourceString = scriptContext->GetLibrary()->GetXDomainFunctionDisplayString();
        }
        Assert(cachedSourceString != nullptr);
        pFuncBody->SetCachedSourceString(cachedSourceString);
        return cachedSourceString;
    }